

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralPlanarAction::IfcStructuralPlanarAction
          (IfcStructuralPlanarAction *this)

{
  IfcStructuralPlanarAction *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x1a8,"IfcStructuralPlanarAction");
  IfcStructuralAction::IfcStructuralAction
            (&this->super_IfcStructuralAction,&PTR_construction_vtable_24__00f4cf80);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralPlanarAction,_1UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralPlanarAction,_1UL> *)
             &(this->super_IfcStructuralAction).field_0x178,&PTR_construction_vtable_24__00f4d0b8);
  *(undefined8 *)
   &(this->super_IfcStructuralAction).super_IfcStructuralActivity.super_IfcProduct.super_IfcObject =
       0xf4ce50;
  *(undefined8 *)&this->field_0x1a8 = 0xf4cf68;
  *(undefined8 *)
   &(this->super_IfcStructuralAction).super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.
    field_0x88 = 0xf4ce78;
  (this->super_IfcStructuralAction).super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0xf4cea0;
  *(undefined8 *)
   &(this->super_IfcStructuralAction).super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.
    field_0xd0 = 0xf4cec8;
  *(undefined8 *)
   &(this->super_IfcStructuralAction).super_IfcStructuralActivity.super_IfcProduct.field_0x100 =
       0xf4cef0;
  *(undefined8 *)&(this->super_IfcStructuralAction).super_IfcStructuralActivity.field_0x138 =
       0xf4cf18;
  *(undefined8 *)&(this->super_IfcStructuralAction).field_0x178 = 0xf4cf40;
  std::__cxx11::string::string((string *)&(this->super_IfcStructuralAction).field_0x188);
  return;
}

Assistant:

IfcStructuralPlanarAction() : Object("IfcStructuralPlanarAction") {}